

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_socket.hpp
# Opt level: O0

bool __thiscall
iutest::detail::SocketWriter::Write(SocketWriter *this,void *buf,size_t size,size_t cnt)

{
  bool bVar1;
  ssize_t sVar2;
  ulong local_40;
  size_t i;
  int size_;
  size_t cnt_local;
  size_t size_local;
  void *buf_local;
  SocketWriter *this_local;
  
  bVar1 = BasicSocket::IsValid
                    ((BasicSocket *)
                     ((this->super_IOutStream)._vptr_IOutStream[-3] +
                     (long)&(this->super_IOutStream)._vptr_IOutStream));
  if (bVar1) {
    for (local_40 = 0; local_40 < cnt; local_40 = local_40 + 1) {
      sVar2 = write(*(int *)((this->super_IOutStream)._vptr_IOutStream[-3] +
                            (long)&(this->super_IOutStream)._vptr_IOutStream),buf,(long)(int)size);
      if (sVar2 == -1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool Write(const void* buf, size_t size, size_t cnt) IUTEST_CXX_OVERRIDE
    {
        if( !IsValid() )
        {
            return false;
        }
        const int size_ = static_cast<int>(size);
        for( size_t i=0; i < cnt; ++i )
        {
#ifdef IUTEST_OS_WINDOWS
            if( send(m_socket, static_cast<const char*>(buf), size_, 0) == SOCKET_ERROR )
            {
                CheckLastError();
                return false;
            }
#else
            if( write(m_socket, buf, size_) == -1 )
            {
                return false;
            }
#endif
        }
        return true;
    }